

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_create_module_function(JSContext *ctx,JSModuleDef *m)

{
  list_head *plVar1;
  uint uVar2;
  int iVar3;
  JSVarRef *pJVar4;
  JSContext *in_RSI;
  undefined8 in_RDI;
  JSReqModuleEntry *rme;
  JSExportEntry *me;
  JSVarRef *var_ref;
  int i;
  BOOL is_c_module;
  int iVar5;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((char)((ulong)(in_RSI->regexp_ctor).tag >> 8) == '\0') {
    uVar2 = (uint)((in_RSI->regexp_ctor).u.ptr != (void *)0x0);
    if (uVar2 == 0) {
      iVar5 = js_create_module_bytecode_function(ctx,m);
      if (iVar5 != 0) {
        return -1;
      }
    }
    else {
      iVar5 = 0;
      while (iVar5 < *(int *)&in_RSI->binary_object_count) {
        plVar1 = (in_RSI->link).next;
        iVar3 = iVar5;
        if (*(int *)&plVar1[(long)iVar5 * 2 + 1].prev == 0) {
          pJVar4 = js_create_module_var
                             ((JSContext *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (BOOL)((ulong)in_RDI >> 0x20));
          if (pJVar4 == (JSVarRef *)0x0) {
            return -1;
          }
          plVar1[(long)iVar5 * 2].next = (list_head *)pJVar4;
        }
        iVar5 = iVar3 + 1;
      }
    }
    (in_RSI->regexp_ctor).tag = (in_RSI->regexp_ctor).tag & 0xffffffffffff00ffU | 0x100;
    for (iVar5 = 0; iVar5 < *(int *)&(in_RSI->link).prev; iVar5 = iVar5 + 1) {
      iVar3 = js_create_module_function(in_RSI,(JSModuleDef *)CONCAT44(uVar2,iVar5));
      if (iVar3 < 0) {
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

static int js_create_module_function(JSContext *ctx, JSModuleDef *m)
{
    BOOL is_c_module;
    int i;
    JSVarRef *var_ref;
    
    if (m->func_created)
        return 0;

    is_c_module = (m->init_func != NULL);

    if (is_c_module) {
        /* initialize the exported variables */
        for(i = 0; i < m->export_entries_count; i++) {
            JSExportEntry *me = &m->export_entries[i];
            if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
                var_ref = js_create_module_var(ctx, FALSE);
                if (!var_ref)
                    return -1;
                me->u.local.var_ref = var_ref;
            }
        }
    } else {
        if (js_create_module_bytecode_function(ctx, m))
            return -1;
    }
    m->func_created = TRUE;

    /* do it on the dependencies */
    
    for(i = 0; i < m->req_module_entries_count; i++) {
        JSReqModuleEntry *rme = &m->req_module_entries[i];
        if (js_create_module_function(ctx, rme->module) < 0)
            return -1;
    }

    return 0;
}